

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O0

void __thiscall Entity::Hit(Entity *this,int points)

{
  int *piVar1;
  ostream *poVar2;
  int local_1c [3];
  Entity *pEStack_10;
  int points_local;
  Entity *this_local;
  
  local_1c[1] = 10;
  local_1c[0] = this->durability - points;
  local_1c[2] = points;
  pEStack_10 = this;
  piVar1 = std::max<int>(local_1c + 1,local_1c);
  this->durability = *piVar1;
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&this->name);
  poVar2 = std::operator<<(poVar2,"Weapon Durability");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->durability);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Entity::Hit(int points) {
  durability = std::max(10, durability - points);
  std::cout << name << "Weapon Durability" << durability << std::endl;
}